

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageIO.c
# Opt level: O1

INT8U * ReadLabelFromFile(char *file_name)

{
  FILE *__stream;
  INT8U *__ptr;
  ulong __size;
  INT32U number_of_image;
  uint local_1c;
  
  puts("----------------");
  printf(anon_var_dwarf_63b,file_name);
  __stream = fopen(file_name,"rb");
  if (__stream == (FILE *)0x0) {
    printf("open image failed!(%s)\n",file_name);
  }
  fread(&local_1c,4,1,__stream);
  puts("----------------");
  __size = (ulong)local_1c;
  printf("number of labels : %d\n",__size);
  __ptr = (INT8U *)malloc(__size);
  fread(__ptr,1,__size,__stream);
  return __ptr;
}

Assistant:

INT8U * ReadLabelFromFile(const char *file_name){
    FILE * fp;
    INT32U number_of_image;
    INT32U image_index,pixel_index;
    INT8U * labelList;

    #if DEBUG_LEVEL>0
        printf("----------------\n");
        printf("打开文件（label）：%s\n",file_name);
    #endif
    fp = fopen(file_name,"rb");
    if(fp==NULL){
        printf("open image failed!(%s)\n",file_name);
    }
    //    图片的数量
    fread(&number_of_image,sizeof(INT32U),1,fp);
    #if DEBUG_LEVEL>0
        printf("----------------\n");
        printf("number of labels : %d\n",number_of_image);
    #endif

    labelList = malloc(sizeof(INT8U)*number_of_image);
//    for(image_index=0;image_index<number_of_image;image_index++){
    fread(labelList,sizeof(INT8U),number_of_image,fp);
//    assert(NULL);
    return labelList;
}